

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

token_type __thiscall
nlohmann::json_abi_v3_11_3::detail::
lexer<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<const_char_*>_>
::scan(lexer<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<const_char_*>_>
       *this)

{
  bool bVar1;
  token_type tVar2;
  pointer pvVar3;
  ulong length;
  lexer<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<const_char_*>_>
  *in_RDI;
  array<char,_4UL> null_literal;
  array<char,_5UL> false_literal;
  array<char,_4UL> true_literal;
  lexer<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<const_char_*>_>
  *in_stack_000000c8;
  lexer<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<const_char_*>_>
  *in_stack_ffffffffffffffb0;
  lexer<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<const_char_*>_>
  *in_stack_ffffffffffffffb8;
  undefined8 in_stack_ffffffffffffffc0;
  undefined7 in_stack_ffffffffffffffd0;
  undefined1 uVar4;
  array<char,_4UL> local_1d;
  array<char,_5UL> local_19;
  array<char,_4UL> local_14 [3];
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if (((in_RDI->position).chars_read_total != 0) ||
     (bVar1 = skip_bom(in_stack_ffffffffffffffb8), bVar1)) {
    skip_whitespace(in_stack_ffffffffffffffb0);
    while( true ) {
      tVar2 = (token_type)((ulong)in_stack_ffffffffffffffc0 >> 0x20);
      uVar4 = false;
      if ((in_RDI->ignore_comments & 1U) != 0) {
        uVar4 = in_RDI->current == 0x2f;
      }
      if ((bool)uVar4 == false) {
        length = (ulong)(in_RDI->current + 1);
        switch(length) {
        case 0:
        case 1:
          return end_of_input;
        default:
          in_RDI->error_message = "invalid literal";
          return parse_error;
        case 0x23:
          tVar2 = scan_string(in_stack_000000c8);
          return tVar2;
        case 0x2d:
          return value_separator;
        case 0x2e:
        case 0x31:
        case 0x32:
        case 0x33:
        case 0x34:
        case 0x35:
        case 0x36:
        case 0x37:
        case 0x38:
        case 0x39:
        case 0x3a:
          tVar2 = scan_number((lexer<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<const_char_*>_>
                               *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
          return tVar2;
        case 0x3b:
          return name_separator;
        case 0x5c:
          return begin_array;
        case 0x5e:
          return end_array;
        case 0x67:
          builtin_strncpy(local_19._M_elems,"false",5);
          std::array<char,_5UL>::data((array<char,_5UL> *)0x19dbdf);
          std::array<char,_5UL>::size(&local_19);
          tVar2 = scan_literal(in_RDI,(char_type *)CONCAT17(uVar4,in_stack_ffffffffffffffd0),length,
                               tVar2);
          return tVar2;
        case 0x6f:
          builtin_strncpy(local_1d._M_elems,"null",4);
          std::array<char,_4UL>::data((array<char,_4UL> *)0x19dc22);
          std::array<char,_4UL>::size(&local_1d);
          tVar2 = scan_literal(in_RDI,(char_type *)CONCAT17(uVar4,in_stack_ffffffffffffffd0),length,
                               tVar2);
          return tVar2;
        case 0x75:
          builtin_strncpy(local_14[0]._M_elems,"true",4);
          pvVar3 = std::array<char,_4UL>::data((array<char,_4UL> *)0x19db92);
          tVar2 = (token_type)((ulong)pvVar3 >> 0x20);
          std::array<char,_4UL>::size(local_14);
          tVar2 = scan_literal(in_RDI,(char_type *)CONCAT17(uVar4,in_stack_ffffffffffffffd0),length,
                               tVar2);
          return tVar2;
        case 0x7c:
          return begin_object;
        case 0x7e:
          return end_object;
        }
      }
      bVar1 = scan_comment(in_stack_ffffffffffffffb8);
      if (!bVar1) break;
      skip_whitespace(in_stack_ffffffffffffffb0);
    }
  }
  else {
    in_RDI->error_message = "invalid BOM; must be 0xEF 0xBB 0xBF if given";
  }
  return parse_error;
}

Assistant:

token_type scan()
    {
        // initially, skip the BOM
        if (position.chars_read_total == 0 && !skip_bom())
        {
            error_message = "invalid BOM; must be 0xEF 0xBB 0xBF if given";
            return token_type::parse_error;
        }

        // read next character and ignore whitespace
        skip_whitespace();

        // ignore comments
        while (ignore_comments && current == '/')
        {
            if (!scan_comment())
            {
                return token_type::parse_error;
            }

            // skip following whitespace
            skip_whitespace();
        }

        switch (current)
        {
            // structural characters
            case '[':
                return token_type::begin_array;
            case ']':
                return token_type::end_array;
            case '{':
                return token_type::begin_object;
            case '}':
                return token_type::end_object;
            case ':':
                return token_type::name_separator;
            case ',':
                return token_type::value_separator;

            // literals
            case 't':
            {
                std::array<char_type, 4> true_literal = {{static_cast<char_type>('t'), static_cast<char_type>('r'), static_cast<char_type>('u'), static_cast<char_type>('e')}};
                return scan_literal(true_literal.data(), true_literal.size(), token_type::literal_true);
            }
            case 'f':
            {
                std::array<char_type, 5> false_literal = {{static_cast<char_type>('f'), static_cast<char_type>('a'), static_cast<char_type>('l'), static_cast<char_type>('s'), static_cast<char_type>('e')}};
                return scan_literal(false_literal.data(), false_literal.size(), token_type::literal_false);
            }
            case 'n':
            {
                std::array<char_type, 4> null_literal = {{static_cast<char_type>('n'), static_cast<char_type>('u'), static_cast<char_type>('l'), static_cast<char_type>('l')}};
                return scan_literal(null_literal.data(), null_literal.size(), token_type::literal_null);
            }

            // string
            case '\"':
                return scan_string();

            // number
            case '-':
            case '0':
            case '1':
            case '2':
            case '3':
            case '4':
            case '5':
            case '6':
            case '7':
            case '8':
            case '9':
                return scan_number();

            // end of input (the null byte is needed when parsing from
            // string literals)
            case '\0':
            case char_traits<char_type>::eof():
                return token_type::end_of_input;

            // error
            default:
                error_message = "invalid literal";
                return token_type::parse_error;
        }
    }